

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  unsigned_long_long uVar1;
  bool bVar2;
  istream *this;
  reference pvVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  undefined1 *puVar7;
  reference pbVar8;
  string local_228 [32];
  iterator local_208;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  iterator local_1f8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  const_iterator i_5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  r;
  unsigned_long_long result;
  string operation;
  iterator local_1a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
  local_1a0;
  iterator local_198;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
  local_190;
  const_iterator ni2;
  string num2Line;
  ulong local_168;
  unsigned_long_long i_4;
  string n2;
  ulonglong local_140;
  unsigned_long_long N2;
  unsigned_long_long S2;
  iterator local_128;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
  local_120;
  iterator local_118;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
  local_110;
  const_iterator ni1;
  string num1Line;
  ulong local_e8;
  unsigned_long_long i_3;
  string n1;
  ulonglong local_c0;
  unsigned_long_long N1;
  unsigned_long_long S1;
  unsigned_long_long i_2;
  ulong local_88;
  size_t i_1;
  size_t nl;
  string numeral;
  pointer local_58;
  unsigned_long_long i;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_39;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nums;
  unsigned_long_long H;
  unsigned_long_long L;
  
  L._4_4_ = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&H);
  std::istream::operator>>
            (this,(ulonglong *)
                  &nums.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::istream::ignore();
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,0x14,&local_39);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_39);
  for (local_58 = (pointer)0x0;
      local_58 <
      nums.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage; local_58 = local_58 + 1) {
    std::__cxx11::string::string((string *)&nl);
    std::operator>>((istream *)&std::cin,(string *)&nl);
    std::istream::ignore();
    i_1 = std::__cxx11::string::length();
    if (H * 0x14 - i_1 != 0) {
      __assert_fail("L*20 == nl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                    ,0x2c,"int main()");
    }
    for (local_88 = 0; local_88 < 0x14; local_88 = local_88 + 1) {
      std::__cxx11::string::substr((ulong)&i_2,(ulong)&nl);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,local_88);
      std::__cxx11::string::operator+=((string *)pvVar3,(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
    }
    std::__cxx11::string::~string((string *)&nl);
  }
  for (S1 = 0; S1 < 0x14; S1 = S1 + 1) {
    std::ios_base::width((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,S1);
    poVar4 = std::operator<<(poVar4,": ");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,S1);
    poVar4 = std::operator<<(poVar4,(string *)pvVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    uVar1 = S1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,S1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](&numbers_abi_cxx11_,pvVar3);
    *pmVar5 = uVar1;
  }
  local_c0 = 0;
  std::__cxx11::string::string((string *)&i_3);
  std::istream::operator>>((istream *)&std::cin,&N1);
  std::istream::ignore();
  for (local_e8 = 0; local_e8 < N1; local_e8 = local_e8 + 1) {
    std::__cxx11::string::string((string *)&ni1);
    std::operator>>((istream *)&std::cin,(string *)&ni1);
    std::istream::ignore();
    std::__cxx11::string::operator+=((string *)&i_3,(string *)&ni1);
    if ((pointer)(local_e8 %
                  (ulong)nums.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) ==
        nums.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
           ::find(&numbers_abi_cxx11_,(key_type *)&i_3);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
      ::_Rb_tree_const_iterator(&local_110,&local_118);
      local_128._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
           ::end(&numbers_abi_cxx11_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
      ::_Rb_tree_const_iterator(&local_120,&local_128);
      bVar2 = std::operator==(&local_120,&local_110);
      if (!bVar2) {
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
                 ::operator->(&local_110);
        local_c0 = ppVar6->second + local_c0 * 0x14;
        poVar4 = std::operator<<((ostream *)&std::cerr,"IR: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c0);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::operator=((string *)&i_3,"");
        goto LAB_001089f4;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown number ");
      poVar4 = std::operator<<(poVar4,(string *)&i_3);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      L._4_4_ = -1;
      S2._4_4_ = 1;
    }
    else {
LAB_001089f4:
      S2._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&ni1);
    if (S2._4_4_ != 0) goto LAB_00109077;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"First number is ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_140 = 0;
  std::__cxx11::string::string((string *)&i_4);
  std::istream::operator>>((istream *)&std::cin,&N2);
  std::istream::ignore();
  for (local_168 = 0; local_168 < N2; local_168 = local_168 + 1) {
    std::__cxx11::string::string((string *)&ni2);
    std::operator>>((istream *)&std::cin,(string *)&ni2);
    std::istream::ignore();
    std::__cxx11::string::operator+=((string *)&i_4,(string *)&ni2);
    if ((pointer)(local_168 %
                  (ulong)nums.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) ==
        nums.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_198._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
           ::find(&numbers_abi_cxx11_,(key_type *)&i_4);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
      ::_Rb_tree_const_iterator(&local_190,&local_198);
      local_1a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
           ::end(&numbers_abi_cxx11_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
      ::_Rb_tree_const_iterator(&local_1a0,&local_1a8);
      bVar2 = std::operator==(&local_1a0,&local_190);
      if (!bVar2) {
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
                 ::operator->(&local_190);
        local_140 = ppVar6->second + local_140 * 0x14;
        std::__cxx11::string::operator=((string *)&i_4,"");
        goto LAB_00108c9c;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown number ");
      poVar4 = std::operator<<(poVar4,(string *)&i_4);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      L._4_4_ = -1;
      S2._4_4_ = 1;
    }
    else {
LAB_00108c9c:
      S2._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&ni2);
    if (S2._4_4_ != 0) goto LAB_0010906b;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Second number is ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_140);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)&result);
  std::operator>>((istream *)&std::cin,(string *)&result);
  std::istream::ignore();
  puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&result);
  switch(*puVar7) {
  case 0x2a:
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = local_c0 * local_140;
    break;
  case 0x2b:
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = local_c0 + local_140;
    break;
  default:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown operation");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    L._4_4_ = -3;
    S2._4_4_ = 1;
    goto LAB_0010905f;
  case 0x2d:
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = local_c0 - local_140;
    break;
  case 0x2f:
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = local_c0 / local_140;
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&i_5);
  do {
    std::ostream::operator<<
              ((ostream *)&std::cerr,
               r.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size +
               (r.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size / 5 & 0xfffffffffffffffc) * -5);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,
                          r.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size +
                          (r.
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl._M_node._M_size / 5 & 0xfffffffffffffffc) * -5);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i_5,pvVar3);
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size =
         r.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node._M_size / 0x14;
  } while (r.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size != 0);
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  local_1f8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_5);
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_1f0,&local_1f8);
  while( true ) {
    local_208._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_5);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_200,&local_208);
    bVar2 = std::operator!=(&local_1f0,&local_200);
    if (!bVar2) break;
    pbVar8 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_1f0);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)pbVar8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pbVar8 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_1f0);
    std::__cxx11::string::string(local_228,(string *)pbVar8);
    print_number((string *)local_228,
                 (unsigned_long_long)
                 nums.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_228);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1f0,0);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&i_5);
  S2._4_4_ = 0;
LAB_0010905f:
  std::__cxx11::string::~string((string *)&result);
LAB_0010906b:
  std::__cxx11::string::~string((string *)&i_4);
LAB_00109077:
  std::__cxx11::string::~string((string *)&i_3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return L._4_4_;
}

Assistant:

int main()
{
    unsigned long long int L;
    unsigned long long int H;
    cin >> L >> H;
    cin.ignore();
    
    std::vector<std::string> nums(20);
    for (unsigned long long int i = 0; i < H; i++)
    {
        string numeral;
        cin >> numeral;
        cin.ignore();
        
        const size_t nl = numeral.length();
        assert(L*20 == nl);
        for (size_t i = 0; i < 20; i++)
        {
            nums[i] += numeral.substr(L*i, L);
        }
    }
    
    for (unsigned long long int i = 0; i < 20; i++)
    {
        cerr.width(2);
        cerr << i << ": " << nums[i] << endl;
        numbers[nums[i]] = i;
    }
    
    unsigned long long int S1;
    unsigned long long int N1 = 0;
    std::string n1;
    cin >> S1;
    cin.ignore();
    for (unsigned long long int i = 0; i < S1; i++)
    {
        string num1Line;
        cin >> num1Line;
        cin.ignore();
        n1 += num1Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni1 = numbers.find(n1);
            if (numbers.end() == ni1)
            {
                cerr << "Unknown number " << n1 << endl;
                return -1;
            }
            N1 = 20*N1 + ni1->second;
            cerr << "IR: " << N1 << endl;
            n1 = "";
        }
    }
    cerr << "First number is " << N1 << endl;
    
    unsigned long long int S2;
    unsigned long long int N2 = 0;
    std::string n2;
    cin >> S2;
    cin.ignore();
    for (unsigned long long int i = 0; i < S2; i++)
    {
        string num2Line;
        cin >> num2Line;
        cin.ignore();
        n2 += num2Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni2 = numbers.find(n2);
            if (numbers.end() == ni2)
            {
                cerr << "Unknown number " << n2 << endl;
                return -1;
            }
            N2 = 20*N2 + ni2->second;
            n2 = "";
        }
    }
    cerr << "Second number is " << N2 << endl;
    
    string operation;
    cin >> operation;
    cin.ignore();
    
    unsigned long long int result;
    switch (operation[0])
    {
        case '+':
            result = N1 + N2;
            break;
            
        case '-':
            result = N1 - N2;
            break;
            
        case '*':
            result = N1*N2;
            break;
            
        case '/':
            result = N1/N2;
            break;
            
        default:
            cerr << "Unknown operation" << endl;
            return -3;
    }
    
    std::list<std::string> r;
    do
    {
        cerr << result % 20;
        r.push_front(nums[result % 20]);
        result /= 20;
    } while (0 < result);
    cerr << endl;
    
    for (std::list<std::string>::const_iterator i = r.begin(); i != r.end(); i++)
    {
        cerr << *i << endl;
        print_number(*i, H);
    }
}